

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

bool __thiscall
PDA::inStackAlphabet
          (PDA *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *s)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  string c;
  string local_70;
  string local_50 [32];
  
  pbVar1 = (s->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (pbVar3 = (s->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string(local_50,(string *)pbVar3);
    if (bVar2 == false) {
      bVar2 = false;
    }
    else {
      std::__cxx11::string::string((string *)&local_70,local_50);
      bVar2 = inStackAlphabet(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string(local_50);
  }
  return bVar2;
}

Assistant:

bool PDA::inStackAlphabet(std::vector<std::string> s) {
    bool in = true;
    for (std::string c: s) {
        in = in && inStackAlphabet(c);
    }
    return in;
}